

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrinsic_geometry_interface.cpp
# Opt level: O0

void __thiscall
geometrycentral::surface::IntrinsicGeometryInterface::computeVertexGaussianCurvatures
          (IntrinsicGeometryInterface *this)

{
  Vertex e;
  Vertex e_00;
  bool bVar1;
  double *pdVar2;
  Etype EVar3;
  Vertex v;
  RangeIteratorBase<geometrycentral::surface::VertexRangeF> __end2;
  RangeIteratorBase<geometrycentral::surface::VertexRangeF> __begin2;
  VertexSet *__range2;
  MeshData<geometrycentral::surface::Vertex,_double> *in_stack_ffffffffffffff28;
  SurfaceMesh *in_stack_ffffffffffffff30;
  ParentMeshT *in_stack_ffffffffffffff40;
  ParentMeshT *this_00;
  ParentMeshT *in_stack_ffffffffffffff48;
  double in_stack_ffffffffffffff50;
  ParentMeshT *pPVar4;
  ParentMeshT *in_stack_ffffffffffffff58;
  MeshData<geometrycentral::surface::Vertex,_double> *in_stack_ffffffffffffff60;
  ParentMeshT *local_98;
  undefined1 local_60 [24];
  undefined1 *local_48;
  
  DependentQuantity::ensureHave((DependentQuantity *)in_stack_ffffffffffffff30);
  MeshData<geometrycentral::surface::Vertex,_double>::MeshData
            (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  MeshData<geometrycentral::surface::Vertex,_double>::operator=
            ((MeshData<geometrycentral::surface::Vertex,_double> *)in_stack_ffffffffffffff30,
             in_stack_ffffffffffffff28);
  MeshData<geometrycentral::surface::Vertex,_double>::~MeshData
            ((MeshData<geometrycentral::surface::Vertex,_double> *)in_stack_ffffffffffffff30);
  SurfaceMesh::vertices(in_stack_ffffffffffffff30);
  local_48 = local_60;
  RangeSetBase<geometrycentral::surface::VertexRangeF>::begin
            ((RangeSetBase<geometrycentral::surface::VertexRangeF> *)in_stack_ffffffffffffff30);
  RangeSetBase<geometrycentral::surface::VertexRangeF>::end
            ((RangeSetBase<geometrycentral::surface::VertexRangeF> *)in_stack_ffffffffffffff30);
  while( true ) {
    bVar1 = RangeIteratorBase<geometrycentral::surface::VertexRangeF>::operator!=
                      ((RangeIteratorBase<geometrycentral::surface::VertexRangeF> *)
                       in_stack_ffffffffffffff30,
                       (RangeIteratorBase<geometrycentral::surface::VertexRangeF> *)
                       in_stack_ffffffffffffff28);
    if (!bVar1) break;
    EVar3 = RangeIteratorBase<geometrycentral::surface::VertexRangeF>::operator*
                      ((RangeIteratorBase<geometrycentral::surface::VertexRangeF> *)0x24371e);
    bVar1 = Vertex::isBoundary((Vertex *)
                               v.
                               super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
                               .mesh);
    if (!bVar1) {
      this_00 = EVar3.
                super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
                .mesh;
      local_98 = (ParentMeshT *)
                 EVar3.
                 super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>
                 .ind;
      e.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.ind =
           (size_t)this_00;
      e.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.mesh
           = in_stack_ffffffffffffff48;
      pPVar4 = this_00;
      pdVar2 = MeshData<geometrycentral::surface::Vertex,_double>::operator[]
                         ((MeshData<geometrycentral::surface::Vertex,_double> *)
                          in_stack_ffffffffffffff40,e);
      in_stack_ffffffffffffff30 = (SurfaceMesh *)(6.283185307179586 - *pdVar2);
      e_00.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
      ind = (size_t)pPVar4;
      e_00.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
      mesh = local_98;
      pdVar2 = MeshData<geometrycentral::surface::Vertex,_double>::operator[]
                         ((MeshData<geometrycentral::surface::Vertex,_double> *)this_00,e_00);
      *pdVar2 = (double)in_stack_ffffffffffffff30;
      in_stack_ffffffffffffff40 = this_00;
      in_stack_ffffffffffffff48 = local_98;
    }
    RangeIteratorBase<geometrycentral::surface::VertexRangeF>::operator++
              ((RangeIteratorBase<geometrycentral::surface::VertexRangeF> *)
               in_stack_ffffffffffffff30);
  }
  return;
}

Assistant:

void IntrinsicGeometryInterface::computeVertexGaussianCurvatures() {
  vertexAngleSumsQ.ensureHave();

  vertexGaussianCurvatures = VertexData<double>(mesh, 0);

  for (Vertex v : mesh.vertices()) {
    if (!v.isBoundary()) {
      vertexGaussianCurvatures[v] = 2. * PI - vertexAngleSums[v];
    }
  }
}